

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int verify_cert_chain(X509_STORE *store,X509 *cert,stack_st_X509 *chain,int is_server,
                     char *server_name,int *ossl_x509_err)

{
  int iVar1;
  X509_STORE_CTX *ctx;
  X509_VERIFY_PARAM *param;
  size_t sVar2;
  X509_VERIFY_PARAM *params;
  int ret;
  X509_STORE_CTX *verify_ctx;
  int *ossl_x509_err_local;
  char *server_name_local;
  int is_server_local;
  stack_st_X509 *chain_local;
  X509 *cert_local;
  X509_STORE *store_local;
  
  *ossl_x509_err = 0;
  ctx = X509_STORE_CTX_new();
  if (ctx == (X509_STORE_CTX *)0x0) {
    params._4_4_ = 0x201;
  }
  else {
    iVar1 = X509_STORE_CTX_init(ctx,(X509_STORE *)store,(X509 *)cert,(stack_st_X509 *)chain);
    if (iVar1 == 1) {
      param = X509_STORE_CTX_get0_param(ctx);
      iVar1 = 2;
      if (is_server != 0) {
        iVar1 = 1;
      }
      X509_VERIFY_PARAM_set_purpose(param,iVar1);
      X509_VERIFY_PARAM_set_depth(param,0x62);
      if ((is_server == 0) && (server_name != (char *)0x0)) {
        iVar1 = ptls_server_name_is_ipaddr(server_name);
        if (iVar1 == 0) {
          sVar2 = strlen(server_name);
          X509_VERIFY_PARAM_set1_host(param,server_name,sVar2);
          X509_VERIFY_PARAM_set_hostflags(param,4);
        }
        else {
          X509_VERIFY_PARAM_set1_ip_asc(param,server_name);
        }
      }
      iVar1 = X509_verify_cert(ctx);
      if (iVar1 == 1) {
        params._4_4_ = 0;
      }
      else {
        iVar1 = X509_STORE_CTX_get_error(ctx);
        *ossl_x509_err = iVar1;
        switch(*ossl_x509_err) {
        case 2:
        case 0x14:
        case 0x1b:
        case 0x1c:
          params._4_4_ = 0x30;
          break;
        default:
          params._4_4_ = 0x2e;
          break;
        case 9:
        case 10:
          params._4_4_ = 0x2d;
          break;
        case 0x11:
          params._4_4_ = 0x201;
          break;
        case 0x17:
          params._4_4_ = 0x2c;
          break;
        case 0x3e:
        case 0x4f:
          params._4_4_ = 0x2a;
        }
      }
    }
    else {
      params._4_4_ = 0x203;
    }
  }
  if (ctx != (X509_STORE_CTX *)0x0) {
    X509_STORE_CTX_free(ctx);
  }
  return params._4_4_;
}

Assistant:

static int verify_cert_chain(X509_STORE *store, X509 *cert, STACK_OF(X509) * chain, int is_server, const char *server_name,
                             int *ossl_x509_err)
{
    X509_STORE_CTX *verify_ctx;
    int ret;
    *ossl_x509_err = 0;

    /* verify certificate chain */
    if ((verify_ctx = X509_STORE_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (X509_STORE_CTX_init(verify_ctx, store, cert, chain) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    { /* setup verify params */
        X509_VERIFY_PARAM *params = X509_STORE_CTX_get0_param(verify_ctx);
        X509_VERIFY_PARAM_set_purpose(params, is_server ? X509_PURPOSE_SSL_CLIENT : X509_PURPOSE_SSL_SERVER);
        X509_VERIFY_PARAM_set_depth(params, 98); /* use the default of OpenSSL 1.0.2 and above; see `man SSL_CTX_set_verify` */
        /* when _acting_ as client, set the server name if provided*/
        if (!is_server && server_name != NULL) {
            if (ptls_server_name_is_ipaddr(server_name)) {
                X509_VERIFY_PARAM_set1_ip_asc(params, server_name);
            } else {
                X509_VERIFY_PARAM_set1_host(params, server_name, strlen(server_name));
                X509_VERIFY_PARAM_set_hostflags(params, X509_CHECK_FLAG_NO_PARTIAL_WILDCARDS);
            }
        }
    }

    if (X509_verify_cert(verify_ctx) != 1) {
        *ossl_x509_err = X509_STORE_CTX_get_error(verify_ctx);
        switch (*ossl_x509_err) {
        case X509_V_ERR_OUT_OF_MEM:
            ret = PTLS_ERROR_NO_MEMORY;
            break;
        case X509_V_ERR_CERT_REVOKED:
            ret = PTLS_ALERT_CERTIFICATE_REVOKED;
            break;
        case X509_V_ERR_CERT_NOT_YET_VALID:
        case X509_V_ERR_CERT_HAS_EXPIRED:
            ret = PTLS_ALERT_CERTIFICATE_EXPIRED;
            break;
        case X509_V_ERR_UNABLE_TO_GET_ISSUER_CERT:
        case X509_V_ERR_UNABLE_TO_GET_ISSUER_CERT_LOCALLY:
        case X509_V_ERR_CERT_UNTRUSTED:
        case X509_V_ERR_CERT_REJECTED:
            ret = PTLS_ALERT_UNKNOWN_CA;
            break;
        case X509_V_ERR_HOSTNAME_MISMATCH:
        case X509_V_ERR_INVALID_CA:
            ret = PTLS_ALERT_BAD_CERTIFICATE;
            break;
        default:
            ret = PTLS_ALERT_CERTIFICATE_UNKNOWN;
            break;
        }
        goto Exit;
    }

    ret = 0;

Exit:
    if (verify_ctx != NULL)
        X509_STORE_CTX_free(verify_ctx);
    return ret;
}